

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall application::Chat::calcPrompt(Chat *this)

{
  pointer pwVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong in_R8;
  
  this->promptLines_ = 1;
  uVar2 = (this->prompt_)._M_string_length;
  if (uVar2 != 0) {
    iVar3 = this->promptLines_;
    pwVar1 = (this->prompt_)._M_dataplus._M_p;
    uVar4 = 0;
    do {
      if (pwVar1[uVar4] == L'\n') {
        iVar3 = iVar3 + 1;
        this->promptLines_ = iVar3;
        in_R8 = uVar4 & 0xffffffff;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    uVar2 = (ulong)(uint)((int)uVar2 - (int)in_R8);
  }
  this->promptLastLine_ = (int)uVar2;
  return;
}

Assistant:

void Chat::calcPrompt()
{
	promptLines_ = 1;
	int lastN, i;
	for (i = 0; i < prompt_.size(); i++)
	{
		if (prompt_[i] == '\n')
		{
			promptLines_++;
			lastN = i;
		}
	}
	promptLastLine_ = i - lastN;
}